

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O3

void D_DoServerInfoChange(BYTE **stream,bool singlebit)

{
  BYTE *__src;
  bool bVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  FBoolCVar *this;
  undefined4 extraout_var;
  undefined8 *puVar6;
  undefined4 extraout_var_00;
  ulong __n;
  ECVarType type;
  int i;
  long lVar7;
  char name [64];
  UCVarValue local_88;
  ECVarType local_7c;
  char local_78 [72];
  
  uVar3 = ReadByte(stream);
  __n = (ulong)(uVar3 & 0x3f);
  if ((uVar3 & 0x3f) == 0) {
    return;
  }
  type = (int)uVar3 >> 6;
  __src = *stream;
  memcpy(local_78,__src,__n);
  *stream = __src + __n;
  local_78[__n] = '\0';
  local_7c = type;
  this = (FBoolCVar *)FindCVar(local_78,(FBaseCVar **)0x0);
  if (singlebit) {
    if (this == (FBoolCVar *)0x0) {
LAB_0037369c:
      bVar1 = true;
      goto LAB_0037369f;
    }
    uVar3 = (*(this->super_FBaseCVar)._vptr_FBaseCVar[5])(this,&local_7c);
    if (local_7c != CVAR_Int) {
      return;
    }
    uVar4 = ReadByte(stream);
    local_88.Int = uVar3 | 1 << (uVar4 & 0x1f);
    if ((uVar4 & 0x20) == 0) {
      local_88.Int = uVar3 & ~(1 << (uVar4 & 0x1f));
    }
    local_88._4_4_ = extraout_var;
    type = local_7c;
  }
  else {
    switch(type) {
    case CVAR_Bool:
      iVar5 = ReadByte(stream);
      local_88.Bool = iVar5 != 0;
      break;
    case CVAR_Int:
      local_88.Int = ReadLong(stream);
      break;
    case CVAR_Float:
      local_88.Float = ReadFloat(stream);
      break;
    case CVAR_String:
      local_88.String = ReadString(stream);
    }
    if (this == (FBoolCVar *)0x0) goto LAB_0037369c;
  }
  bVar1 = false;
  FBaseCVar::ForceSet((FBaseCVar *)this,local_88,type,false);
  type = local_7c;
LAB_0037369f:
  if ((type == CVAR_String) && (local_88.String != (char *)0x0)) {
    operator_delete__(local_88.String);
  }
  if (this == &teamplay) {
    lVar7 = 0;
    do {
      if (playeringame[lVar7] == true) {
        puVar2 = (undefined8 *)
                 ((ulong)(((&DAT_017e1e88)[lVar7 * 0xa8] - 1 & 0x203) * 0x18) +
                 (&DAT_017e1e78)[lVar7 * 0x54]);
        do {
          puVar6 = puVar2;
          puVar2 = (undefined8 *)*puVar6;
        } while (*(int *)(puVar6 + 1) != 0x203);
        UpdateTeam((int)lVar7,*(int *)(puVar6[2] + 0x28),true);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
  }
  if (!bVar1) {
    iVar5 = (*(this->super_FBaseCVar)._vptr_FBaseCVar[4])(this,3);
    if ((CONCAT44(extraout_var_00,iVar5) != 0) && (netgame == true)) {
      Printf("%s changed to %s\n",local_78,CONCAT44(extraout_var_00,iVar5));
    }
  }
  return;
}

Assistant:

void D_DoServerInfoChange (BYTE **stream, bool singlebit)
{
	const char *value;
	char name[64];
	int len;
	int type;

	len = ReadByte (stream);
	type = len >> 6;
	len &= 0x3f;
	if (len == 0)
		return;
	memcpy (name, *stream, len);
	*stream += len;
	name[len] = 0;

	if ( (value = SetServerVar (name, (ECVarType)type, stream, singlebit)) && netgame)
	{
		Printf ("%s changed to %s\n", name, value);
	}
}